

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls,int extDict)

{
  BYTE *pBVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  uint *puVar11;
  int iVar12;
  BYTE *pBVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar20;
  uint local_b4;
  uint *local_b0;
  ulong local_a0;
  U32 dummy32;
  ulong local_80;
  BYTE *local_78;
  BYTE *local_70;
  byte *local_68;
  BYTE *local_60;
  BYTE *local_58;
  ulong local_50;
  U32 *local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar19;
  
  pUVar5 = ms->hashTable;
  sVar7 = ZSTD_hashPtr(ip,(ms->cParams).hashLog,mls);
  uVar14 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  pBVar6 = (ms->window).base;
  uVar18 = (int)ip - (int)pBVar6;
  uVar19 = (ulong)uVar18;
  uVar15 = uVar18 - uVar14;
  if (uVar18 < uVar14) {
    uVar15 = 0;
  }
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x472d,
                  "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                 );
  }
  local_48 = ms->chainTable;
  uVar2 = pUVar5[sVar7];
  local_78 = (ms->window).dictBase;
  local_80 = (ulong)(ms->window).dictLimit;
  uVar3 = (ms->window).lowLimit;
  uVar4 = (ms->cParams).searchLog;
  pUVar5[sVar7] = uVar18;
  if (uVar3 == 0) {
    __assert_fail("windowLow > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4730,
                  "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                 );
  }
  local_58 = local_78 + local_80;
  local_60 = pBVar6 + local_80;
  uVar8 = (ulong)((uVar18 & uVar14) * 2);
  local_b0 = local_48 + uVar8;
  puVar11 = local_48 + uVar8 + 1;
  local_b4 = uVar18 + 9;
  iVar12 = 1 << ((byte)uVar4 & 0x1f);
  local_a0 = 8;
  uVar8 = 0;
  uVar9 = 0;
  local_70 = ip;
  local_68 = iend;
  local_50 = uVar19;
  do {
    uVar17 = (ulong)uVar2;
    bVar20 = iVar12 == 0;
    iVar12 = iVar12 + -1;
    if ((bVar20) || (uVar2 < uVar3)) goto LAB_001542ae;
    uVar16 = uVar8;
    if (uVar9 < uVar8) {
      uVar16 = uVar9;
    }
    if ((uint)uVar19 <= uVar2) {
      __assert_fail("matchIndex < current",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4734,
                    "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                   );
    }
    local_40 = uVar8;
    local_38 = uVar9;
    if ((extDict == 0) || (local_80 <= uVar16 + uVar17)) {
      if (uVar16 + uVar17 < local_80) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x474c,
                      "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                     );
      }
      sVar7 = ZSTD_count(local_70 + uVar16,pBVar6 + uVar17 + uVar16,local_68);
      uVar9 = sVar7 + uVar16;
      pBVar13 = pBVar6 + uVar17;
    }
    else {
      pBVar1 = local_78 + uVar17;
      sVar7 = ZSTD_count_2segments(local_70 + uVar16,pBVar1 + uVar16,local_68,local_58,local_60);
      uVar9 = sVar7 + uVar16;
      pBVar13 = pBVar6 + uVar17;
      uVar19 = local_50;
      if (uVar9 + uVar17 < local_80) {
        pBVar13 = pBVar1;
      }
    }
    if ((local_a0 < uVar9) && (local_a0 = uVar9, local_b4 - uVar2 < uVar9)) {
      local_b4 = uVar2 + (int)uVar9;
    }
    if (local_70 + uVar9 == local_68) goto LAB_001542ae;
    puVar10 = local_48 + (uVar2 & uVar14) * 2;
    if (pBVar13[uVar9] < local_70[uVar9]) {
      *local_b0 = uVar2;
      if (uVar2 <= uVar15) {
        local_b0 = &dummy32;
LAB_001542ae:
        *puVar11 = 0;
        *local_b0 = 0;
        uVar14 = local_b4 - (uVar18 + 8);
        if (local_b4 < uVar18 + 8 || uVar14 == 0) {
          __assert_fail("matchEndIdx > current + 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4773,
                        "U32 ZSTD_insertBt1(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const int)"
                       );
        }
        uVar18 = (int)local_a0 - 0x180;
        uVar15 = 0xc0;
        if (uVar18 < 0xc0) {
          uVar15 = uVar18;
        }
        uVar18 = 0;
        if (0x180 < local_a0) {
          uVar18 = uVar15;
        }
        if (uVar18 <= uVar14) {
          uVar18 = uVar14;
        }
        return uVar18;
      }
      puVar10 = puVar10 + 1;
      uVar8 = local_40;
      local_b0 = puVar10;
    }
    else {
      *puVar11 = uVar2;
      puVar11 = puVar10;
      uVar8 = uVar9;
      uVar9 = local_38;
      if (uVar2 <= uVar15) {
        puVar11 = &dummy32;
        goto LAB_001542ae;
      }
    }
    uVar2 = *puVar10;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 current = (U32)(ip-base);
    const U32 btLow = btMask >= current ? 0 : current - btMask;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = current+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((current-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((current-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", current);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = current;   /* Update Hash Table */

    assert(windowLow > 0);
    while (nbCompares-- && (matchIndex >= windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > current + 8);
        return MAX(positions, matchEndIdx - (current + 8));
    }
}